

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_Domainreset_Test::~InterpreterTestSuite_PC_Domainreset_Test
          (InterpreterTestSuite_PC_Domainreset_Test *this)

{
  InterpreterTestSuite_PC_Domainreset_Test *this_local;
  
  InterpreterTestSuite::~InterpreterTestSuite(&this->super_InterpreterTestSuite);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_Domainreset)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, DomainReset(_)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("domainreset 1234::5678");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}